

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject * udata2finalize(global_State *g)

{
  GCObject *pGVar1;
  GCObject *o;
  global_State *g_local;
  
  pGVar1 = g->tobefnz;
  if ((pGVar1->marked & 0x40) == 0) {
    __assert_fail("(((o)->marked) & ((1<<(6))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x3d4,"GCObject *udata2finalize(global_State *)");
  }
  g->tobefnz = pGVar1->next;
  pGVar1->next = g->allgc;
  g->allgc = pGVar1;
  pGVar1->marked = pGVar1->marked & 0xbf;
  if ((g->gcstate < 3) || (6 < g->gcstate)) {
    if ((pGVar1->marked & 7) == 3) {
      g->firstold1 = pGVar1;
    }
  }
  else {
    pGVar1->marked = pGVar1->marked & 199 | g->currentwhite & 0x18;
  }
  return pGVar1;
}

Assistant:

static GCObject *udata2finalize (global_State *g) {
  GCObject *o = g->tobefnz;  /* get first element */
  lua_assert(tofinalize(o));
  g->tobefnz = o->next;  /* remove it from 'tobefnz' list */
  o->next = g->allgc;  /* return it to 'allgc' list */
  g->allgc = o;
  resetbit(o->marked, FINALIZEDBIT);  /* object is "normal" again */
  if (issweepphase(g))
    makewhite(g, o);  /* "sweep" object */
  else if (getage(o) == G_OLD1)
    g->firstold1 = o;  /* it is the first OLD1 object in the list */
  return o;
}